

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

float direction_magnitude(vw *all)

{
  _Hash_node_base *p_Var1;
  float fVar2;
  weight *pwVar3;
  uint64_t uVar4;
  float fVar5;
  _Hash_node_base *p_Var6;
  long lVar7;
  
  if ((all->weights).sparse == true) {
    p_Var6 = (all->weights).sparse_weights._map._M_h._M_before_begin._M_nxt;
    if (p_Var6 == (_Hash_node_base *)0x0) {
      return 0.0;
    }
    fVar5 = 0.0;
    do {
      p_Var1 = p_Var6 + 2;
      p_Var6 = p_Var6->_M_nxt;
      fVar2 = *(float *)&p_Var1->_M_nxt[1]._M_nxt;
      fVar5 = fVar5 + fVar2 * fVar2;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  else {
    pwVar3 = (all->weights).dense_weights._begin;
    uVar4 = (all->weights).dense_weights._weight_mask;
    if (pwVar3 == pwVar3 + uVar4 + 1) {
      return 0.0;
    }
    fVar5 = 0.0;
    lVar7 = 0;
    do {
      fVar2 = *(float *)((long)pwVar3 + lVar7 + 8);
      fVar5 = fVar5 + fVar2 * fVar2;
      lVar7 = lVar7 + (1L << ((byte)(all->weights).dense_weights._stride_shift & 0x3f)) * 4;
    } while (uVar4 * 4 + 4 != lVar7);
  }
  return fVar5;
}

Assistant:

float direction_magnitude(vw& all)
{
  // compute direction magnitude
  if (all.weights.sparse)
    return direction_magnitude(all, all.weights.sparse_weights);
  else
    return direction_magnitude(all, all.weights.dense_weights);
}